

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O0

void __thiscall soul::Optimisations::Inliner::perform(Inliner *this)

{
  Module *pMVar1;
  Function *pFVar2;
  size_t blockIndex;
  Allocator *this_00;
  FunctionCall *pFVar3;
  bool bVar4;
  Block *pBVar5;
  reference pvVar6;
  Variable *pVVar7;
  Expression *pEVar8;
  AssignFromValue *newObject;
  pool_ref<soul::heart::Variable> *this_01;
  string *psVar9;
  pool_ref *ppVar10;
  mapped_type *pmVar11;
  size_type sVar12;
  vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
  *this_02;
  mapped_type *pmVar13;
  Branch *o;
  Block *source;
  LinkedList<soul::heart::Statement> *this_03;
  ulong local_2c8;
  size_t i_1;
  pool_ref<soul::heart::Block> *local_2b8;
  pool_ref<soul::heart::Block> *local_2b0;
  __normal_iterator<soul::pool_ref<soul::heart::Block>_*,_std::vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>_>
  local_2a8;
  __normal_iterator<soul::pool_ref<soul::heart::Block>_*,_std::vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>_>
  local_2a0;
  const_iterator local_298;
  pool_ptr<soul::heart::Block> local_290;
  pool_ref<soul::heart::Block> local_288;
  Identifier local_280;
  Block *local_278;
  Block *newBlock;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  pool_ref<soul::heart::Block> *b;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
  *__range2;
  pool_ptr<soul::heart::Variable> local_1c0;
  string local_1b8;
  Type local_198;
  Variable *local_180;
  Variable *localParamVar;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> newParamName;
  Variable *param;
  size_t i;
  BlockBuilder builder;
  Identifier local_a8;
  Type local_a0;
  pool_ptr<soul::heart::Variable> local_88;
  Block *local_80;
  Block *preBlock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Iterator local_20;
  Block *local_18;
  Block *postBlock;
  Inliner *this_local;
  
  pMVar1 = this->module;
  pFVar2 = this->parentFunction;
  blockIndex = this->blockIndex;
  postBlock = (Block *)this;
  LinkedList<soul::heart::Statement>::Iterator::Iterator(&local_20,(Statement *)this->call);
  std::operator+(&local_60,"@",&this->inlinedFnName);
  std::operator+(&local_40,&local_60,"_end");
  pBVar5 = heart::Utilities::splitBlock(pMVar1,pFVar2,blockIndex,local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  local_18 = pBVar5;
  pool_ptr<soul::heart::Block>::pool_ptr<soul::heart::Block,void>
            ((pool_ptr<soul::heart::Block> *)&preBlock,pBVar5);
  (this->postCallResumeBlock).object = preBlock;
  pool_ptr<soul::heart::Block>::~pool_ptr((pool_ptr<soul::heart::Block> *)&preBlock);
  pvVar6 = std::
           vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ::operator[](&this->parentFunction->blocks,this->blockIndex);
  local_80 = pool_ref<soul::heart::Block>::get(pvVar6);
  LinkedList<soul::heart::Statement>::remove(&local_80->statements,(char *)this->call);
  bVar4 = Type::isVoid(&this->targetFunction->returnType);
  if (!bVar4) {
    pMVar1 = this->module;
    Type::Type(&local_a0,&this->targetFunction->returnType);
    this_00 = this->module->allocator;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &builder.lastStatementInCurrentBlock,&this->inlinedFnName,"_retval");
    local_a8 = heart::Allocator::get<std::__cxx11::string>
                         (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&builder.lastStatementInCurrentBlock);
    pVVar7 = BlockBuilder::createVariable<soul::Identifier>(pMVar1,&local_a0,&local_a8,mutableLocal)
    ;
    pool_ptr<soul::heart::Variable>::pool_ptr<soul::heart::Variable,void>(&local_88,pVVar7);
    (this->returnValueVar).object = local_88.object;
    pool_ptr<soul::heart::Variable>::~pool_ptr(&local_88);
    std::__cxx11::string::~string((string *)&builder.lastStatementInCurrentBlock);
    Type::~Type(&local_a0);
    this_03 = &local_18->statements;
    pMVar1 = this->module;
    pFVar3 = this->call;
    pEVar8 = pool_ptr<soul::heart::Expression>::operator*(&(this->call->super_Assignment).target);
    pVVar7 = pool_ptr<soul::heart::Variable>::operator*(&this->returnValueVar);
    newObject = Module::
                allocate<soul::heart::AssignFromValue,soul::CodeLocation&,soul::heart::Expression&,soul::heart::Variable&>
                          (pMVar1,&(pFVar3->super_Assignment).super_Statement.super_Object.location,
                           pEVar8,pVVar7);
    LinkedList<soul::heart::Statement>::insertFront(this_03,(Statement *)newObject);
  }
  BlockBuilder::BlockBuilder((BlockBuilder *)&i,this->module,local_80);
  for (param = (Variable *)0x0;
      pVVar7 = (Variable *)
               ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL>::size
                         (&this->targetFunction->parameters), param < pVVar7;
      param = (Variable *)((long)&(param->super_Expression).super_Object._vptr_Object + 1)) {
    this_01 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL>::operator[]
                        (&this->targetFunction->parameters,(size_t)param);
    newParamName.field_2._8_8_ = pool_ref<soul::heart::Variable>::get(this_01);
    std::operator+(&local_138,&this->inlinedFnName,"_param_");
    psVar9 = Identifier::operator_cast_to_string_((Identifier *)(newParamName.field_2._8_8_ + 0x30))
    ;
    std::__cxx11::string::string((string *)&localParamVar,(string *)psVar9);
    makeSafeIdentifierName(&local_158,(string *)&localParamVar);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   &local_138,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&localParamVar);
    std::__cxx11::string::~string((string *)&local_138);
    Type::Type(&local_198,(Type *)(newParamName.field_2._8_8_ + 0x18));
    std::__cxx11::string::string((string *)&local_1b8,(string *)local_118);
    pVVar7 = BlockBuilder::createMutableLocalVariable((BlockBuilder *)&i,&local_198,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    Type::~Type(&local_198);
    local_180 = pVVar7;
    ppVar10 = (pool_ref *)
              ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::operator[]
                        (&this->call->arguments,(size_t)param);
    pEVar8 = pool_ref::operator_cast_to_Expression_(ppVar10);
    BlockBuilder::addAssignment((BlockBuilder *)&i,&pVVar7->super_Expression,pEVar8);
    pool_ptr<soul::heart::Variable>::pool_ptr<soul::heart::Variable,void>(&local_1c0,local_180);
    pool_ref<soul::heart::Variable>::pool_ref<soul::heart::Variable,void>
              ((pool_ref<soul::heart::Variable> *)&__range2,(Variable *)newParamName.field_2._8_8_);
    pmVar11 = std::
              unordered_map<soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>_>
              ::operator[](&this->remappedVariables,(pool_ref<soul::heart::Variable> *)&__range2);
    pmVar11->object = local_1c0.object;
    pool_ref<soul::heart::Variable>::~pool_ref((pool_ref<soul::heart::Variable> *)&__range2);
    pool_ptr<soul::heart::Variable>::~pool_ptr(&local_1c0);
    std::__cxx11::string::~string((string *)local_118);
  }
  BlockBuilder::~BlockBuilder((BlockBuilder *)&i);
  sVar12 = std::
           vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ::size(&this->targetFunction->blocks);
  std::
  vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>::
  reserve(&this->newBlocks,sVar12);
  this_02 = &this->targetFunction->blocks;
  __end2 = std::
           vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ::begin(this_02);
  b = (pool_ref<soul::heart::Block> *)
      std::
      vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
      ::end(this_02);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<soul::pool_ref<soul::heart::Block>_*,_std::vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>_>
                                     *)&b), bVar4) {
    name.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<soul::pool_ref<soul::heart::Block>_*,_std::vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>_>
         ::operator*(&__end2);
    std::operator+(&local_228,"@",&this->inlinedFnName);
    bVar4 = std::
            vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
            ::empty(&this->newBlocks);
    newBlock._7_1_ = 0;
    if (bVar4) {
      std::__cxx11::string::string((string *)&local_248);
    }
    else {
      sVar12 = std::
               vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
               ::size(&this->newBlocks);
      std::__cxx11::to_string(&local_268,sVar12);
      newBlock._7_1_ = 1;
      std::operator+(&local_248,"_",&local_268);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                   &local_228,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    if ((newBlock._7_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_268);
    }
    std::__cxx11::string::~string((string *)&local_228);
    pMVar1 = this->module;
    local_280 = heart::Allocator::get<std::__cxx11::string>
                          (pMVar1->allocator,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_208);
    local_278 = Module::allocate<soul::heart::Block,soul::Identifier>(pMVar1,&local_280);
    pool_ref<soul::heart::Block>::pool_ref<soul::heart::Block,void>(&local_288,local_278);
    std::
    vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
    ::push_back(&this->newBlocks,&local_288);
    pool_ref<soul::heart::Block>::~pool_ref(&local_288);
    pool_ptr<soul::heart::Block>::pool_ptr<soul::heart::Block,void>(&local_290,local_278);
    pmVar13 = std::
              unordered_map<soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>,_std::hash<soul::pool_ref<soul::heart::Block>_>,_std::equal_to<soul::pool_ref<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>_>
              ::operator[](&this->remappedBlocks,(key_type *)name.field_2._8_8_);
    pmVar13->object = local_290.object;
    pool_ptr<soul::heart::Block>::~pool_ptr(&local_290);
    std::__cxx11::string::~string((string *)local_208);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::heart::Block>_*,_std::vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>_>
    ::operator++(&__end2);
  }
  pFVar2 = this->parentFunction;
  local_2a0 = getIteratorForIndex<std::vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>,unsigned_long>
                        (&this->parentFunction->blocks,this->blockIndex + 1);
  __gnu_cxx::
  __normal_iterator<soul::pool_ref<soul::heart::Block>const*,std::vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>>
  ::__normal_iterator<soul::pool_ref<soul::heart::Block>*>
            ((__normal_iterator<soul::pool_ref<soul::heart::Block>const*,std::vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>>
              *)&local_298,&local_2a0);
  local_2a8._M_current =
       (pool_ref<soul::heart::Block> *)
       std::
       vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
       ::begin(&this->newBlocks);
  local_2b0 = (pool_ref<soul::heart::Block> *)
              std::
              vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
              ::end(&this->newBlocks);
  local_2b8 = (pool_ref<soul::heart::Block> *)
              std::
              vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>
              ::
              insert<__gnu_cxx::__normal_iterator<soul::pool_ref<soul::heart::Block>*,std::vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>>,void>
                        ((vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>
                          *)&pFVar2->blocks,local_298,local_2a8,
                         (__normal_iterator<soul::pool_ref<soul::heart::Block>_*,_std::vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>_>
                          )local_2b0);
  pMVar1 = this->module;
  pvVar6 = std::
           vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ::front(&this->newBlocks);
  o = Module::allocate<soul::heart::Branch,soul::pool_ref<soul::heart::Block>&>(pMVar1,pvVar6);
  pool_ptr<soul::heart::Terminator>::pool_ptr<soul::heart::Branch,void>
            ((pool_ptr<soul::heart::Terminator> *)&i_1,o);
  (local_80->terminator).object = (Terminator *)i_1;
  pool_ptr<soul::heart::Terminator>::~pool_ptr((pool_ptr<soul::heart::Terminator> *)&i_1);
  for (local_2c8 = 0;
      sVar12 = std::
               vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
               ::size(&this->newBlocks), local_2c8 < sVar12; local_2c8 = local_2c8 + 1) {
    ppVar10 = (pool_ref *)
              std::
              vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
              ::operator[](&this->newBlocks,local_2c8);
    pBVar5 = pool_ref::operator_cast_to_Block_(ppVar10);
    ppVar10 = (pool_ref *)
              std::
              vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
              ::operator[](&this->targetFunction->blocks,local_2c8);
    source = pool_ref::operator_cast_to_Block_(ppVar10);
    cloneBlock(this,pBVar5,source);
  }
  return;
}

Assistant:

void perform()
        {
            auto& postBlock = heart::Utilities::splitBlock (module, parentFunction, blockIndex, call, "@" + inlinedFnName + "_end");
            postCallResumeBlock = postBlock;
            auto& preBlock = parentFunction.blocks[blockIndex].get();

            preBlock.statements.remove (call);

            if (! targetFunction.returnType.isVoid())
            {
                returnValueVar = BlockBuilder::createVariable (module, targetFunction.returnType,
                                                               module.allocator.get (inlinedFnName + "_retval"),
                                                               heart::Variable::Role::mutableLocal);

                postBlock.statements.insertFront (module.allocate<heart::AssignFromValue> (call.location, *call.target, *returnValueVar));
            }

            {
                BlockBuilder builder (module, preBlock);

                for (size_t i = 0; i < targetFunction.parameters.size(); ++i)
                {
                    auto& param = targetFunction.parameters[i].get();
                    auto newParamName = inlinedFnName + "_param_" + makeSafeIdentifierName (param.name);
                    auto& localParamVar = builder.createMutableLocalVariable (param.type, newParamName);
                    builder.addAssignment (localParamVar, call.arguments[i]);
                    remappedVariables[param] = localParamVar;
                }
            }

            newBlocks.reserve (targetFunction.blocks.size());

            for (auto& b : targetFunction.blocks)
            {
                // NB: the name of the first block must be "@" + inlinedFnName, since that's what the unique
                // name picker will look for to make sure there's not a block name clash
                auto name = "@" + inlinedFnName + (newBlocks.empty() ? std::string() : ("_" + std::to_string (newBlocks.size())));
                auto& newBlock = module.allocate<heart::Block> (module.allocator.get (name));
                newBlocks.push_back (newBlock);
                remappedBlocks[b] = newBlock;
            }

            parentFunction.blocks.insert (getIteratorForIndex (parentFunction.blocks, blockIndex + 1),
                                          newBlocks.begin(), newBlocks.end());

            preBlock.terminator = module.allocate<heart::Branch> (newBlocks.front());

            for (size_t i = 0; i < newBlocks.size(); ++i)
                cloneBlock (newBlocks[i], targetFunction.blocks[i]);
        }